

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

void commit_v(uint8_t *digest,uint8_t *input,msgs_t *msgs,picnic_instance_t *params)

{
  uint capacity;
  uint rate;
  ulong uVar1;
  hash_context ctx;
  Keccak_HashInstance KStack_108;
  
  if (params->digest_size == ' ') {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  Keccak_HashInitialize(&KStack_108,rate,capacity,0,'\x1f');
  Keccak_HashUpdate(&KStack_108,input,(ulong)params->input_output_size << 3);
  if (params->num_MPC_parties != '\0') {
    uVar1 = 0;
    do {
      Keccak_HashUpdate(&KStack_108,msgs->msgs[uVar1],(ulong)((int)msgs->pos + 7U & 0xfffffff8));
      uVar1 = uVar1 + 1;
    } while (uVar1 < params->num_MPC_parties);
  }
  Keccak_HashFinal(&KStack_108,(BitSequence *)0x0);
  Keccak_HashSqueeze(&KStack_108,digest,(ulong)params->digest_size << 3);
  return;
}

Assistant:

static void commit_v(uint8_t* digest, const uint8_t* input, const msgs_t* msgs,
                     const picnic_instance_t* params) {
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  hash_update(&ctx, input, params->input_output_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update(&ctx, msgs->msgs[i], numBytes(msgs->pos));
  }
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}